

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_identifier(version_parser *this,string *out)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  undefined8 extraout_RDX;
  size_t k;
  char *ptr;
  token_stream *this_00;
  from_chars_result fVar4;
  bool local_a1;
  uchar digit;
  undefined8 local_58;
  token token;
  string result;
  string *out_local;
  version_parser *this_local;
  errc local_10;
  
  this_00 = (token_stream *)out;
  std::__cxx11::string::string((string *)&token.lexeme);
  local_58 = token_stream::advance((token *)this->stream,this_00);
  token._0_8_ = extraout_RDX;
  do {
    if ((token_type)local_58 == hyphen) {
      std::__cxx11::string::push_back((char)&token + '\b');
    }
    else if ((token_type)local_58 == letter) {
      std::get<char,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> *)
                 ((long)&local_58 + 1));
      std::__cxx11::string::push_back((char)&token + '\b');
    }
    else {
      if ((token_type)local_58 != digit) {
        fVar4 = failure((char *)token._0_8_,invalid_argument);
        this_local = (version_parser *)fVar4.super_from_chars_result.ptr;
        local_10 = fVar4.super_from_chars_result.ec;
        goto LAB_00106b3a;
      }
      pbVar3 = std::
               get<unsigned_char,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_58 + 1));
      bVar1 = *pbVar3;
      bVar2 = is_leading_zero(this,(uint)bVar1);
      if (bVar2) {
        fVar4 = failure((char *)token._0_8_,invalid_argument);
        this_local = (version_parser *)fVar4.super_from_chars_result.ptr;
        local_10 = fVar4.super_from_chars_result.ec;
        goto LAB_00106b3a;
      }
      to_char((uint)bVar1);
      std::__cxx11::string::push_back((char)&token + '\b');
    }
    bVar2 = token_stream::advanceIfMatch(this->stream,(token *)&local_58,hyphen);
    local_a1 = true;
    if (!bVar2) {
      bVar2 = token_stream::advanceIfMatch(this->stream,(token *)&local_58,letter);
      local_a1 = true;
      if (!bVar2) {
        local_a1 = token_stream::advanceIfMatch(this->stream,(token *)&local_58,digit);
      }
    }
  } while (local_a1 != false);
  std::__cxx11::string::operator=((string *)out,(string *)&token.lexeme);
  token_stream::peek((token *)this->stream,(token_stream *)0x0,k);
  fVar4 = success(ptr);
  this_local = (version_parser *)fVar4.super_from_chars_result.ptr;
  local_10 = fVar4.super_from_chars_result.ec;
LAB_00106b3a:
  std::__cxx11::string::~string((string *)&token.lexeme);
  fVar4.super_from_chars_result.ec = local_10;
  fVar4.super_from_chars_result.ptr = (char *)this_local;
  fVar4.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar4.super_from_chars_result;
}

Assistant:

parse_prerelease_identifier(std::string& out) {
    std::string result;
    token token = stream.advance();

    do {
      switch (token.type) {
      case token_type::hyphen:
        result.push_back('-');
        break;
      case token_type::letter:
        result.push_back(std::get<char>(token.value));
        break;
      case token_type::digit:
      {
        const auto digit = std::get<std::uint8_t>(token.value);

        // numerical prerelease identifier doesn't allow leading zero 
        // 1.2.3-1.alpha is valid,
        // 1.2.3-01b is valid as well, but
        // 1.2.3-01.alpha is not valid

        if (is_leading_zero(digit)) {
          return failure(token.lexeme);
        }

        result.push_back(to_char(digit));
        break;
      }
      default:
        return failure(token.lexeme);
      }
    } while (stream.advanceIfMatch(token, token_type::hyphen) || stream.advanceIfMatch(token, token_type::letter) || stream.advanceIfMatch(token, token_type::digit));

    out = result;
    return success(stream.peek().lexeme);
  }